

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintBundle.h
# Opt level: O0

void __thiscall PrintBundle::LoadLayerSettings(PrintBundle *this)

{
  byte bVar1;
  bool bVar2;
  undefined8 uVar3;
  istream *piVar4;
  long lVar5;
  char *pcVar6;
  ostream *this_00;
  size_type sVar7;
  int *in_RDI;
  string OneAttribute;
  size_t pos;
  Layer L;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rowData;
  string line;
  string file;
  ifstream LayerInfoFile;
  value_type *in_stack_fffffffffffffc28;
  Layer *in_stack_fffffffffffffc30;
  value_type *in_stack_fffffffffffffc38;
  string *in_stack_fffffffffffffc40;
  string *in_stack_fffffffffffffc50;
  string *in_stack_fffffffffffffc58;
  string *in_stack_fffffffffffffc60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc68;
  int __val;
  string local_370 [32];
  string local_350 [32];
  string local_330 [32];
  string local_310 [32];
  string local_2f0 [32];
  string local_2d0 [32];
  undefined8 local_2b0;
  int local_2a8;
  int local_2a4;
  int local_2a0;
  int local_29c;
  string local_298 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_278;
  string local_260 [48];
  string local_230 [32];
  istream local_210 [528];
  
  std::ifstream::ifstream(local_210);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc58,(char *)in_stack_fffffffffffffc50);
  uVar3 = std::__cxx11::string::c_str();
  std::ifstream::open(local_210,uVar3,8);
  *in_RDI = 0;
  std::__cxx11::string::string(local_260);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    this_00 = std::operator<<((ostream *)&std::cout,"Unable to read in Settings file. Check again");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  else {
    std::getline<char,std::char_traits<char>,std::allocator<char>>(local_210,local_260);
    while( true ) {
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_210,local_260);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
      if (!bVar2) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x10c2dd);
      Layer::Layer(in_stack_fffffffffffffc30);
      while( true ) {
        lVar5 = std::__cxx11::string::length();
        bVar2 = false;
        if (lVar5 != 0) {
          lVar5 = std::__cxx11::string::find((char)local_260,0x2c);
          bVar2 = lVar5 != -1;
        }
        __val = (int)((ulong)piVar4 >> 0x20);
        if (!bVar2) break;
        std::__cxx11::string::string(local_2d0);
        in_stack_fffffffffffffc68 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        in_stack_fffffffffffffc60 = local_260;
        local_2b0 = std::__cxx11::string::find_first_of((char)in_stack_fffffffffffffc60,0x2c);
        std::__cxx11::string::substr((ulong)local_2f0,(ulong)in_stack_fffffffffffffc60);
        in_stack_fffffffffffffc58 = local_2d0;
        in_stack_fffffffffffffc50 = local_2f0;
        std::__cxx11::string::operator=(in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
        std::__cxx11::string::~string(in_stack_fffffffffffffc50);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
        std::__cxx11::string::erase((ulong)local_260,0);
        std::__cxx11::string::~string(local_2d0);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_278,0);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      local_2a8 = atoi(pcVar6);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_278,1);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      local_2a4 = atoi(pcVar6);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_278,2);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      local_2a0 = atoi(pcVar6);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_278,3);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      local_29c = atoi(pcVar6);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffc58,(char *)in_stack_fffffffffffffc50);
      std::__cxx11::to_string(__val);
      std::operator+(in_stack_fffffffffffffc68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffc60);
      std::operator+(in_stack_fffffffffffffc38,(char *)in_stack_fffffffffffffc30);
      in_stack_fffffffffffffc40 = local_310;
      std::__cxx11::string::operator=(local_298,in_stack_fffffffffffffc40);
      std::__cxx11::string::~string(in_stack_fffffffffffffc40);
      std::__cxx11::string::~string(local_330);
      std::__cxx11::string::~string(local_370);
      std::__cxx11::string::~string(local_350);
      std::queue<Layer,_std::deque<Layer,_std::allocator<Layer>_>_>::push
                ((queue<Layer,_std::deque<Layer,_std::allocator<Layer>_>_> *)
                 in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
      *in_RDI = *in_RDI + 1;
      Layer::~Layer((Layer *)0x10c622);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffc40);
    }
  }
  sVar7 = std::queue<Layer,_std::deque<Layer,_std::allocator<Layer>_>_>::size
                    ((queue<Layer,_std::deque<Layer,_std::allocator<Layer>_>_> *)0x10c70c);
  *in_RDI = (int)sVar7;
  std::ifstream::close();
  std::__cxx11::string::~string(local_260);
  std::__cxx11::string::~string(local_230);
  std::ifstream::~ifstream(local_210);
  return;
}

Assistant:

void PrintBundle::LoadLayerSettings()
{
	ifstream LayerInfoFile;
	string file = Folder + "/layersettings.csv";
	LayerInfoFile.open(file.c_str());
	
	numLayers = 0;
	string line;
	if (LayerInfoFile.is_open())
	{
		//Get rid of the first row
		getline(LayerInfoFile, line);

		//Parse remaining rows
		while(getline(LayerInfoFile, line))
		{
			vector <string> rowData;
			Layer L;

			while(line.length() != 0 && line.find(',') != string::npos)
			{
				size_t pos;
				string OneAttribute;
				pos = line.find_first_of(',');
				OneAttribute = line.substr(0, pos);
				rowData.push_back(OneAttribute);
				line.erase(0, pos+1);

			}
			rowData.push_back(line);

			L.index = atoi(rowData[0].c_str());
			L.FirstApproachWait = atoi(rowData[1].c_str());
			L.BurnInApproachWait = atoi(rowData[2].c_str());
			L.ModelApproachWait = atoi(rowData[3].c_str());
			L.imageLoc = Folder + "/slice_" + to_string(numLayers+1) + ".png";
			
			Layers.push(L);
			numLayers++;

		}
		
	}

	else
		cout << "Unable to read in Settings file. Check again" << endl;

	numLayers = Layers.size();

	LayerInfoFile.close();

}